

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

char * SpellcheckString(char *text,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  long *local_150;
  long local_138 [4];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  allocator<char> local_79;
  string local_78;
  value_type local_48;
  char *word;
  vector<const_char_*,_std::allocator<const_char_*>_> words;
  va_list ap;
  char *text_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  ap[0]._0_8_ = &stack0x00000008;
  words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x30;
  words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
  local_138[1] = in_RSI;
  local_138[2] = in_RDX;
  local_138[3] = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&word);
  while( true ) {
    if ((uint)words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < 0x29) {
      local_150 = (long *)((long)local_138 +
                          (long)(int)(uint)words.
                                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 8;
    }
    else {
      local_150 = (long *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    local_48 = (value_type)*local_150;
    if (local_48 == (value_type)0x0) break;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&word,&local_48);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,text,&local_79);
  pcVar1 = SpellcheckStringV(&local_78,(vector<const_char_*,_std::allocator<const_char_*>_> *)&word)
  ;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&word);
  return pcVar1;
}

Assistant:

const char* SpellcheckString(const char* text, ...) {
  // Note: This takes a const char* instead of a string& because using
  // va_start() with a reference parameter is undefined behavior.
  va_list ap;
  va_start(ap, text);
  vector<const char*> words;
  const char* word;
  while ((word = va_arg(ap, const char*)))
    words.push_back(word);
  va_end(ap);
  return SpellcheckStringV(text, words);
}